

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O0

ssh2_userkey * openssh_pem_read(BinarySource *filesrc,char *passphrase,char **errmsg_p)

{
  ptrlen pl;
  ptrlen data;
  ptrlen data_00;
  ptrlen str;
  char *pcVar1;
  ec_curve *self;
  int iVar2;
  openssh_pem_key *b;
  strbuf *buf_o;
  ssh_cipher *c;
  ssh_key *psVar3;
  ssh_keyalg *psVar4;
  _func_ssh_key_ptr_ssh_keyalg_ptr_ptrlen_ptrlen *p_Var5;
  ptrlen pVar6;
  ptrlen pVar7;
  undefined1 local_270 [8];
  ber_item integer_1;
  ptrlen rsa_modulus;
  ssh_keyalg *local_228;
  void *local_220;
  void *local_218;
  ber_item local_210;
  ber_item local_1f8;
  ber_item local_1e0;
  ber_item local_1c8;
  ber_item local_1b0;
  ec_curve *local_198;
  ec_curve *curve;
  ssh_keyalg *alg_1;
  ber_item pubkey;
  ber_item oid;
  ber_item sub1;
  ber_item sub0;
  ber_item privkey;
  ber_item integer;
  ber_item seq;
  ssh_cipher *cipher;
  uint8_t local_b8 [8];
  uchar keybuf [32];
  int local_8c;
  int publen;
  int privptr;
  strbuf *blob;
  char *errmsg;
  ssh2_userkey *retval;
  int num_integers;
  int i;
  BinarySource src [1];
  ssh_keyalg *alg;
  ssh2_userkey *retkey;
  openssh_pem_key *key;
  char **errmsg_p_local;
  char *passphrase_local;
  BinarySource *filesrc_local;
  
  b = load_openssh_pem_key(filesrc,errmsg_p);
  errmsg = (char *)0x0;
  buf_o = strbuf_new_nm();
  local_8c = 0;
  if (b == (openssh_pem_key *)0x0) {
    strbuf_free(buf_o);
    return (ssh2_userkey *)0x0;
  }
  if ((b->encrypted & 1U) != 0) {
    pVar6 = ptrlen_from_asciz(passphrase);
    openssh_pem_derivekey(pVar6,b->iv,local_b8);
    if (b->encryption == OP_E_3DES) {
      des3_decrypt_pubkey_ossh(local_b8,b->iv,b->keyblob->u,(int)b->keyblob->len);
    }
    else {
      c = ssh_cipher_new(&ssh_aes128_cbc);
      ssh_cipher_setkey(c,local_b8);
      ssh_cipher_setiv(c,b->iv);
      ssh_cipher_decrypt(c,b->keyblob->u,(int)b->keyblob->len);
      ssh_cipher_free(c);
    }
    smemclr(local_b8,0x20);
  }
  pVar6 = make_ptrlen(b->keyblob->u,b->keyblob->len);
  BinarySource_INIT__((BinarySource *)&num_integers,pVar6);
  BinarySource_get_ber((ber_item *)&integer.data.len,(BinarySource *)src[0]._24_8_);
  if ((*(int *)(src[0]._24_8_ + 0x18) != 0) || ((int)integer.data.len != 0x10)) {
    blob = (strbuf *)anon_var_dwarf_7ebe;
    errmsg = (char *)0x0;
    if ((b->encrypted & 1U) != 0) {
      errmsg = (char *)&ssh2_wrong_passphrase;
    }
    goto LAB_001174c8;
  }
  BinarySource_INIT__((BinarySource *)&num_integers,(ptrlen)seq._0_16_);
  if (b->keytype == OP_RSA) {
    retval._0_4_ = 9;
  }
  else if (b->keytype == OP_DSA) {
    retval._0_4_ = 6;
  }
  else {
    retval._0_4_ = 0;
  }
  if (b->keytype == OP_ECDSA) {
    BinarySource_get_ber(&local_1b0,(BinarySource *)src[0]._24_8_);
    integer._0_8_ = local_1b0.data.ptr;
    integer.data.ptr = (void *)local_1b0.data.len;
    BinarySource_get_ber(&local_1c8,(BinarySource *)src[0]._24_8_);
    BinarySource_get_ber(&local_1e0,(BinarySource *)src[0]._24_8_);
    BinarySource_get_ber(&local_1f8,(BinarySource *)src[0]._24_8_);
    data_00.len = local_1e0.data.len;
    data_00.ptr = local_1e0.data.ptr;
    BinarySource_INIT__((BinarySource *)&num_integers,data_00);
    BinarySource_get_ber(&local_210,(BinarySource *)src[0]._24_8_);
    pubkey.data.len._0_4_ = local_210.id;
    pubkey.data.len._4_4_ = local_210.flags;
    data.len = local_1f8.data.len;
    data.ptr = local_1f8.data.ptr;
    BinarySource_INIT__((BinarySource *)&num_integers,data);
    BinarySource_get_ber((ber_item *)&local_228,(BinarySource *)src[0]._24_8_);
    alg_1 = local_228;
    psVar4 = alg_1;
    pubkey._0_8_ = local_220;
    pubkey.data.ptr = local_218;
    alg_1 = psVar4;
    if ((((*(int *)(src[0]._24_8_ + 0x18) != 0) || (local_1b0.id != 2)) ||
        ((integer.data.ptr != (void *)0x1 ||
         ((((*(char *)integer._0_8_ != '\x01' || (local_1c8.id != 4)) || (local_1e0.id != 0)) ||
          ((local_1f8.id != 1 || ((int)pubkey.data.len != 6)))))))) ||
       (alg_1._0_4_ = (int)local_228, (int)alg_1 != 3)) {
      blob = (strbuf *)anon_var_dwarf_7ebe;
      errmsg = (char *)0x0;
      if ((b->encrypted & 1U) != 0) {
        errmsg = (char *)&ssh2_wrong_passphrase;
      }
      goto LAB_001174c8;
    }
    curve = (ec_curve *)ec_alg_by_oid((int)local_210.data.len,local_210.data.ptr,&local_198);
    if ((ssh_keyalg *)curve == (ssh_keyalg *)0x0) {
      blob = (strbuf *)anon_var_dwarf_7ec9;
      errmsg = (char *)0x0;
      goto LAB_001174c8;
    }
    if (pubkey.data.ptr != (void *)((local_198->fieldBits + 7 >> 3) * 2 + 2)) {
      blob = (strbuf *)anon_var_dwarf_7ebe;
      errmsg = (char *)0x0;
      if ((b->encrypted & 1U) != 0) {
        errmsg = (char *)&ssh2_wrong_passphrase;
      }
      goto LAB_001174c8;
    }
    pubkey._0_8_ = pubkey._0_8_ + 1;
    pubkey.data.ptr = (void *)((long)pubkey.data.ptr + -1);
    alg = (ssh_keyalg *)safemalloc(1,0x10,0);
    BinarySink_put_stringz(buf_o->binarysink_,curve[2].name);
    BinarySink_put_stringz(buf_o->binarysink_,local_198->name);
    pl.len = (size_t)pubkey.data.ptr;
    pl.ptr = (void *)pubkey._0_8_;
    BinarySink_put_stringpl(buf_o->binarysink_,pl);
    iVar2 = (int)buf_o->len;
    str.len = local_1c8.data.len;
    str.ptr = local_1c8.data.ptr;
    BinarySink_put_mp_ssh2_from_string(buf_o->binarysink_,str);
    self = curve;
    pVar6 = make_ptrlen(buf_o->u,(long)iVar2);
    pVar7 = make_ptrlen(buf_o->u + iVar2,buf_o->len - (long)iVar2);
    psVar3 = ssh_key_new_priv((ssh_keyalg *)self,pVar6,pVar7);
    alg->new_pub = (_func_ssh_key_ptr_ssh_keyalg_ptr_ptrlen *)psVar3;
    if (alg->new_pub == (_func_ssh_key_ptr_ssh_keyalg_ptr_ptrlen *)0x0) {
      safefree(alg);
      blob = (strbuf *)anon_var_dwarf_7ee0;
      goto LAB_001174c8;
    }
  }
  else {
    if ((b->keytype != OP_RSA) && (b->keytype != OP_DSA)) {
      __assert_fail("false && \"Bad key type from load_openssh_pem_key\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c",
                    0x316,
                    "ssh2_userkey *openssh_pem_read(BinarySource *, const char *, const char **)");
    }
    pcVar1 = "opensshcert-ssh-rsa";
    if (b->keytype == OP_DSA) {
      pcVar1 = "opensshcert-ssh-dss";
    }
    BinarySink_put_stringz(buf_o->binarysink_,pcVar1 + 0xc);
    join_0x00000010_0x00000000_ = make_ptrlen("",0);
    for (retval._4_4_ = 0; retval._4_4_ < (int)retval; retval._4_4_ = retval._4_4_ + 1) {
      BinarySource_get_ber((ber_item *)local_270,(BinarySource *)src[0]._24_8_);
      if ((*(int *)(src[0]._24_8_ + 0x18) != 0) || (local_270._0_4_ != 2)) {
        blob = (strbuf *)anon_var_dwarf_7ebe;
        errmsg = (char *)0x0;
        if ((b->encrypted & 1U) != 0) {
          errmsg = (char *)&ssh2_wrong_passphrase;
        }
        goto LAB_001174c8;
      }
      if (retval._4_4_ == 0) {
        if ((integer_1.data.ptr != (void *)0x1) || (*(char *)integer_1._0_8_ != '\0')) {
          blob = (strbuf *)anon_var_dwarf_7f24;
          goto LAB_001174c8;
        }
      }
      else if (b->keytype == OP_RSA) {
        if (retval._4_4_ == 1) {
          rsa_modulus.ptr = integer_1.data.ptr;
          integer_1.data.len._0_4_ = integer_1.id;
          integer_1.data.len._4_4_ = integer_1.flags;
        }
        else if (((retval._4_4_ != 6) && (retval._4_4_ != 7)) &&
                (pVar7.len = (size_t)integer_1.data.ptr, pVar7.ptr = (void *)integer_1._0_8_,
                BinarySink_put_mp_ssh2_from_string(buf_o->binarysink_,pVar7), retval._4_4_ == 2)) {
          BinarySink_put_mp_ssh2_from_string(buf_o->binarysink_,stack0xfffffffffffffda8);
          local_8c = (int)buf_o->len;
        }
      }
      else if ((b->keytype == OP_DSA) &&
              (pVar6.len = (size_t)integer_1.data.ptr, pVar6.ptr = (void *)integer_1._0_8_,
              BinarySink_put_mp_ssh2_from_string(buf_o->binarysink_,pVar6), retval._4_4_ == 4)) {
        local_8c = (int)buf_o->len;
      }
    }
    if (local_8c < 1) {
      __assert_fail("privptr > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c",
                    0x308,
                    "ssh2_userkey *openssh_pem_read(BinarySource *, const char *, const char **)");
    }
    alg = (ssh_keyalg *)safemalloc(1,0x10,0);
    psVar4 = &ssh_dsa;
    if (b->keytype == OP_RSA) {
      psVar4 = &ssh_rsa;
    }
    src[0].binarysource_ = (BinarySource *)psVar4;
    pVar6 = make_ptrlen(buf_o->u,(long)local_8c);
    pVar7 = make_ptrlen(buf_o->u + local_8c,buf_o->len - (long)local_8c);
    psVar3 = ssh_key_new_priv(psVar4,pVar6,pVar7);
    alg->new_pub = (_func_ssh_key_ptr_ssh_keyalg_ptr_ptrlen *)psVar3;
    if (alg->new_pub == (_func_ssh_key_ptr_ssh_keyalg_ptr_ptrlen *)0x0) {
      safefree(alg);
      blob = (strbuf *)anon_var_dwarf_7ee0;
      goto LAB_001174c8;
    }
  }
  p_Var5 = (_func_ssh_key_ptr_ssh_keyalg_ptr_ptrlen_ptrlen *)dupstr("imported-openssh-key");
  alg->new_priv = p_Var5;
  blob = (strbuf *)0x0;
  errmsg = (char *)alg;
LAB_001174c8:
  strbuf_free(buf_o);
  strbuf_free(b->keyblob);
  smemclr(b,0x38);
  safefree(b);
  if (errmsg_p != (char **)0x0) {
    *errmsg_p = (char *)blob;
  }
  return (ssh2_userkey *)errmsg;
}

Assistant:

static ssh2_userkey *openssh_pem_read(
    BinarySource *filesrc, const char *passphrase, const char **errmsg_p)
{
    struct openssh_pem_key *key = load_openssh_pem_key(filesrc, errmsg_p);
    ssh2_userkey *retkey;
    const ssh_keyalg *alg;
    BinarySource src[1];
    int i, num_integers;
    ssh2_userkey *retval = NULL;
    const char *errmsg;
    strbuf *blob = strbuf_new_nm();
    int privptr = 0, publen;

    if (!key) {
        strbuf_free(blob);
        return NULL;
    }

    if (key->encrypted) {
        unsigned char keybuf[32];
        openssh_pem_derivekey(ptrlen_from_asciz(passphrase), key->iv, keybuf);

        /*
         * Decrypt the key blob.
         */
        if (key->encryption == OP_E_3DES)
            des3_decrypt_pubkey_ossh(keybuf, key->iv,
                                     key->keyblob->u, key->keyblob->len);
        else {
            ssh_cipher *cipher = ssh_cipher_new(&ssh_aes128_cbc);
            ssh_cipher_setkey(cipher, keybuf);
            ssh_cipher_setiv(cipher, key->iv);
            ssh_cipher_decrypt(cipher, key->keyblob->u, key->keyblob->len);
            ssh_cipher_free(cipher);
        }

        smemclr(keybuf, sizeof(keybuf));
    }

    /*
     * Now we have a decrypted key blob, which contains an ASN.1
     * encoded private key. We must now untangle the ASN.1.
     *
     * We expect the whole key blob to be formatted as a SEQUENCE
     * (0x30 followed by a length code indicating that the rest of
     * the blob is part of the sequence). Within that SEQUENCE we
     * expect to see a bunch of INTEGERs. What those integers mean
     * depends on the key type:
     *
     *  - For RSA, we expect the integers to be 0, n, e, d, p, q,
     *    dmp1, dmq1, iqmp in that order. (The last three are d mod
     *    (p-1), d mod (q-1), inverse of q mod p respectively.)
     *
     *  - For DSA, we expect them to be 0, p, q, g, y, x in that
     *    order.
     *
     *  - In ECDSA the format is totally different: we see the
     *    SEQUENCE, but beneath is an INTEGER 1, OCTET STRING priv
     *    EXPLICIT [0] OID curve, EXPLICIT [1] BIT STRING pubPoint
     */

    BinarySource_BARE_INIT(src, key->keyblob->u, key->keyblob->len);

    {
        /* Expect the SEQUENCE header. Take its absence as a failure to
         * decrypt, if the key was encrypted. */
        ber_item seq = get_ber(src);
        if (get_err(src) || seq.id != 16) {
            errmsg = "ASN.1 decoding failure";
            retval = key->encrypted ? SSH2_WRONG_PASSPHRASE : NULL;
            goto error;
        }

        /* Reinitialise our BinarySource to parse just the inside of that
         * SEQUENCE. */
        BinarySource_BARE_INIT_PL(src, seq.data);
    }

    /* Expect a load of INTEGERs. */
    if (key->keytype == OP_RSA)
        num_integers = 9;
    else if (key->keytype == OP_DSA)
        num_integers = 6;
    else
        num_integers = 0;              /* placate compiler warnings */


    if (key->keytype == OP_ECDSA) {
        /* And now for something completely different */
        ber_item integer, privkey, sub0, sub1, oid, pubkey;
        const ssh_keyalg *alg;
        const struct ec_curve *curve;

        /* Parse the outer layer of things inside the containing SEQUENCE */
        integer = get_ber(src);
        privkey = get_ber(src);
        sub0 = get_ber(src);
        sub1 = get_ber(src);

        /* Now look inside sub0 for the curve OID */
        BinarySource_BARE_INIT_PL(src, sub0.data);
        oid = get_ber(src);

        /* And inside sub1 for the public-key BIT STRING */
        BinarySource_BARE_INIT_PL(src, sub1.data);
        pubkey = get_ber(src);

        if (get_err(src) ||
            integer.id != 2 ||
            integer.data.len != 1 ||
            ((const unsigned char *)integer.data.ptr)[0] != 1 ||
            privkey.id != 4 ||
            sub0.id != 0 ||
            sub1.id != 1 ||
            oid.id != 6 ||
            pubkey.id != 3) {

            errmsg = "ASN.1 decoding failure";
            retval = key->encrypted ? SSH2_WRONG_PASSPHRASE : NULL;
            goto error;
        }

        alg = ec_alg_by_oid(oid.data.len, oid.data.ptr, &curve);
        if (!alg) {
            errmsg = "Unsupported ECDSA curve.";
            retval = NULL;
            goto error;
        }
        if (pubkey.data.len != ((((curve->fieldBits + 7) / 8) * 2) + 2)) {
            errmsg = "ASN.1 decoding failure";
            retval = key->encrypted ? SSH2_WRONG_PASSPHRASE : NULL;
            goto error;
        }
        /* Skip 0x00 before point */
        pubkey.data.ptr = (const char *)pubkey.data.ptr + 1;
        pubkey.data.len -= 1;

        /* Construct the key */
        retkey = snew(ssh2_userkey);

        put_stringz(blob, alg->ssh_id);
        put_stringz(blob, curve->name);
        put_stringpl(blob, pubkey.data);
        publen = blob->len;
        put_mp_ssh2_from_string(blob, privkey.data);

        retkey->key = ssh_key_new_priv(
            alg, make_ptrlen(blob->u, publen),
            make_ptrlen(blob->u + publen, blob->len - publen));

        if (!retkey->key) {
            sfree(retkey);
            errmsg = "unable to create key data structure";
            goto error;
        }

    } else if (key->keytype == OP_RSA || key->keytype == OP_DSA) {

        put_stringz(blob, key->keytype == OP_DSA ? "ssh-dss" : "ssh-rsa");

        ptrlen rsa_modulus = PTRLEN_LITERAL("");

        for (i = 0; i < num_integers; i++) {
            ber_item integer = get_ber(src);

            if (get_err(src) || integer.id != 2) {
                errmsg = "ASN.1 decoding failure";
                retval = key->encrypted ? SSH2_WRONG_PASSPHRASE : NULL;
                goto error;
            }

            if (i == 0) {
                /*
                 * The first integer should be zero always (I think
                 * this is some sort of version indication).
                 */
                if (integer.data.len != 1 ||
                    ((const unsigned char *)integer.data.ptr)[0] != 0) {
                    errmsg = "version number mismatch";
                    goto error;
                }
            } else if (key->keytype == OP_RSA) {
                /*
                 * Integers 1 and 2 go into the public blob but in the
                 * opposite order; integers 3, 4, 5 and 8 go into the
                 * private blob. The other two (6 and 7) are ignored.
                 */
                if (i == 1) {
                    /* Save the details for after we deal with number 2. */
                    rsa_modulus = integer.data;
                } else if (i != 6 && i != 7) {
                    put_mp_ssh2_from_string(blob, integer.data);
                    if (i == 2) {
                        put_mp_ssh2_from_string(blob, rsa_modulus);
                        privptr = blob->len;
                    }
                }
            } else if (key->keytype == OP_DSA) {
                /*
                 * Integers 1-4 go into the public blob; integer 5 goes
                 * into the private blob.
                 */
                put_mp_ssh2_from_string(blob, integer.data);
                if (i == 4)
                    privptr = blob->len;
            }
        }

        /*
         * Now put together the actual key. Simplest way to do this is
         * to assemble our own key blobs and feed them to the createkey
         * functions; this is a bit faffy but it does mean we get all
         * the sanity checks for free.
         */
        assert(privptr > 0);          /* should have bombed by now if not */
        retkey = snew(ssh2_userkey);
        alg = (key->keytype == OP_RSA ? &ssh_rsa : &ssh_dsa);
        retkey->key = ssh_key_new_priv(
            alg, make_ptrlen(blob->u, privptr),
            make_ptrlen(blob->u+privptr, blob->len-privptr));

        if (!retkey->key) {
            sfree(retkey);
            errmsg = "unable to create key data structure";
            goto error;
        }

    } else {
        unreachable("Bad key type from load_openssh_pem_key");
        errmsg = "Bad key type from load_openssh_pem_key";
        goto error;
    }

    /*
     * The old key format doesn't include a comment in the private
     * key file.
     */
    retkey->comment = dupstr("imported-openssh-key");

    errmsg = NULL;                     /* no error */
    retval = retkey;

    error:
    strbuf_free(blob);
    strbuf_free(key->keyblob);
    smemclr(key, sizeof(*key));
    sfree(key);
    if (errmsg_p) *errmsg_p = errmsg;
    return retval;
}